

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O0

ktx_error_code_e
ktxVulkanTexture_Destruct_WithSuballocator
          (ktxVulkanTexture *vkTexture,VkDevice device,VkAllocationCallbacks *pAllocator,
          ktxVulkanTexture_subAllocatorCallbacks *subAllocatorCallbacks)

{
  bool bVar1;
  long *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ktx_bool_t useSuballocator;
  
  bVar1 = false;
  if (in_RCX != (long *)0x0) {
    if ((((*in_RCX == 0) || (in_RCX[1] == 0)) || (in_RCX[2] == 0)) ||
       (((in_RCX[3] == 0 || (in_RCX[4] == 0)) || (in_RCX[5] == 0)))) {
      return KTX_INVALID_VALUE;
    }
    bVar1 = true;
  }
  (*(code *)*in_RDI)(in_RSI,in_RDI[2],in_RDX);
  if (bVar1) {
    (*(code *)in_RCX[5])(in_RDI[8]);
  }
  else {
    (*(code *)in_RDI[1])(in_RSI,in_RDI[4],in_RDX);
  }
  return KTX_SUCCESS;
}

Assistant:

ktx_error_code_e
ktxVulkanTexture_Destruct_WithSuballocator(ktxVulkanTexture* vkTexture, VkDevice device,
                                           const VkAllocationCallbacks* pAllocator,
                                           ktxVulkanTexture_subAllocatorCallbacks* subAllocatorCallbacks)
{
    ktx_bool_t useSuballocator = false;
    if (subAllocatorCallbacks) {
        if (subAllocatorCallbacks->allocMemFuncPtr &&
            subAllocatorCallbacks->bindBufferFuncPtr &&
            subAllocatorCallbacks->bindImageFuncPtr &&
            subAllocatorCallbacks->memoryMapFuncPtr &&
            subAllocatorCallbacks->memoryUnmapFuncPtr &&
            subAllocatorCallbacks->freeMemFuncPtr)
            useSuballocator = true;
        else
            return KTX_INVALID_VALUE;
    }

    vkTexture->vkDestroyImage(device, vkTexture->image, pAllocator);
    if (useSuballocator)
        subAllocatorCallbacks->freeMemFuncPtr(vkTexture->allocationId);
    else
        vkTexture->vkFreeMemory(device, vkTexture->deviceMemory, pAllocator);

    return KTX_SUCCESS;
}